

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

void do_cmd_go_up(command *cmd)

{
  short sVar1;
  wchar_t feat;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  level_conflict *plVar2;
  char *name;
  player_upkeep *ppVar3;
  level_map_conflict *map;
  _Bool _Var4;
  wchar_t place;
  int iVar5;
  wchar_t wVar6;
  feature *pfVar7;
  level_conflict *plVar8;
  loc_conflict *plVar9;
  command *cmd_00;
  char *pcVar10;
  player *ppVar11;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pfVar7 = square_feat(cave,grid);
  feat = pfVar7->fidx;
  grid_00.x = (player->grid).x;
  grid_00.y = (player->grid).y;
  _Var4 = square_isstairs(cave,grid_00);
  if (!_Var4) {
    grid_01.x = (player->grid).x;
    grid_01.y = (player->grid).y;
    cmd_00 = (command *)cave;
    _Var4 = square_ispath(cave,grid_01);
    if (!_Var4) {
      do_cmd_navigate_up(cmd_00);
      return;
    }
  }
  grid_02.x = (player->grid).x;
  grid_02.y = (player->grid).y;
  _Var4 = square_isdownstairs(cave,grid_02);
  if (_Var4) {
    grid_03.x = (player->grid).x;
    grid_03.y = (player->grid).y;
    _Var4 = square_ispath(cave,grid_03);
    if (_Var4) {
      pcVar10 = "This is a path to greater danger.";
    }
    else {
      pcVar10 = "This staircase leads down.";
    }
LAB_0012c385:
    msg(pcVar10);
    return;
  }
  if (player->themed_level != '\0') {
    _Var4 = get_check("This level will never appear again.  Really leave?");
    if (!_Var4) {
      return;
    }
  }
  sVar1 = player->place;
  pcVar10 = path_direction(feat);
  place = player_get_next_place((int)sVar1,pcVar10,L'\x01');
  ppVar11 = player;
  player->upkeep->energy_use = (uint)z_info->move_energy;
  map = world;
  if (feat == FEAT_LESS) {
    iVar5 = strcmp(world->name,"Hybrid Dungeon");
    pcVar10 = "You enter a maze of up staircases.";
    if ((iVar5 == 0) && (ppVar11->depth != 1)) {
      plVar2 = map->levels;
      sVar1 = ppVar11->place;
      name = plVar2[sVar1].up;
      if (name == (char *)0x0) {
        pcVar10 = "Nothing happens!";
        goto LAB_0012c385;
      }
      plVar8 = level_by_name(map,name);
      if (plVar2[sVar1].locality != plVar8->locality) {
        msgt(0x4e,"You trigger a magic portal.");
        ppVar11 = player;
        goto LAB_0012c42c;
      }
    }
  }
  else {
    pcVar10 = "You enter a winding path to less danger.";
  }
  msgt(0x4e,pcVar10);
  wVar6 = return_path(feat);
  ppVar11 = player;
  ppVar3 = player->upkeep;
  ppVar3->create_stair = wVar6;
  if ((((feat == FEAT_LESS_NORTH) || (feat == FEAT_MORE_NORTH)) || (feat == FEAT_LESS_SOUTH)) ||
     (feat == FEAT_MORE_SOUTH)) {
    plVar9 = &ppVar11->grid;
  }
  else {
    if (((feat != FEAT_LESS_EAST) && (feat != FEAT_MORE_EAST)) &&
       ((feat != FEAT_LESS_WEST && (feat != FEAT_MORE_WEST)))) goto LAB_0012c42c;
    plVar9 = (loc_conflict *)&(ppVar11->grid).y;
  }
  ppVar3->path_coord = plVar9->x;
LAB_0012c42c:
  player_change_place(ppVar11,place);
  return;
}

Assistant:

void do_cmd_go_up(struct command *cmd)
{
	int feat = square_feat(cave, player->grid)->fidx;
	int new_place;

	/* Verify stairs */
	if (!(square_isstairs(cave, player->grid) ||
		  square_ispath(cave, player->grid))) {
		do_cmd_navigate_up(cmd);
		return;
	} else if (square_isdownstairs(cave, player->grid)) {
		if (square_ispath(cave, player->grid)) {
			msg("This is a path to greater danger.");
			return;
		} else {
			msg("This staircase leads down.");
			return;
		}
	}

	/* Make certain the player really wants to leave a themed level. -LM- */
	if (player->themed_level) {
		if (!get_check("This level will never appear again.  Really leave?")) {
			return;
		}
	}

	/* Force descend */
	//if (OPT(player, birth_force_descend)) {
	//	msg("Nothing happens!");
	//	return;
	//}

	new_place = player_get_next_place(player->place, path_direction(feat), 1);

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Success */
	if (feat == FEAT_LESS) {
		/* Magical portal for dungeon-only games */
		if (streq(world->name, "Hybrid Dungeon") && (player->depth != 1)) {
			struct level *lev = &world->levels[player->place];
			if (lev->up) {
				struct level *up = level_by_name(world, lev->up);
				if (lev->locality != up->locality) {
					/* Portal */
					msgt(MSG_STAIRS_UP, "You trigger a magic portal.");

					/* Change level */
					player_change_place(player, new_place);
					return;
				}
			} else {
				msg("Nothing happens!");
				return;
			}
		}
		msgt(MSG_STAIRS_UP, "You enter a maze of up staircases.");
	} else {
		msgt(MSG_STAIRS_UP, "You enter a winding path to less danger.");
	}

	/* Create a way back */
	player->upkeep->create_stair = return_path(feat);

	/* Record the non-obvious exit coordinate */
	if ((feat == FEAT_LESS_NORTH) || (feat == FEAT_MORE_NORTH) ||
		(feat == FEAT_LESS_SOUTH) || (feat == FEAT_MORE_SOUTH)) {
		player->upkeep->path_coord = player->grid.x;
	} else if ((feat == FEAT_LESS_EAST) || (feat == FEAT_MORE_EAST) ||
			   (feat == FEAT_LESS_WEST) || (feat == FEAT_MORE_WEST)) {
		player->upkeep->path_coord = player->grid.y;
	}

	/* Change level */
	player_change_place(player, new_place);
}